

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateZeroInitFields
          (MessageGenerator *this,Printer *p)

{
  pointer ppFVar1;
  bool bVar2;
  FieldGenerator *pFVar3;
  Iterator end;
  FieldDescriptor *first;
  anon_class_24_3_f542e84b emit_pending_zero_fields;
  FieldDescriptor *local_50;
  Printer *local_48;
  anon_class_24_3_f542e84b local_40;
  
  local_40.p = &local_48;
  local_40.first = &local_50;
  local_50 = (FieldDescriptor *)0x0;
  ppFVar1 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_48 = p;
  local_40.this = this;
  for (end._M_current =
            (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start; end._M_current != ppFVar1;
      end._M_current = end._M_current + 1) {
    bVar2 = ShouldSplit(*end._M_current,&this->options_);
    if (bVar2) break;
    pFVar3 = FieldGeneratorTable::get(&this->field_generators_,*end._M_current);
    if (((pFVar3->impl_)._M_t.
         super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGeneratorBase,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGeneratorBase>_>
         .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGeneratorBase_*,_false>.
        _M_head_impl)->has_trivial_zero_default_ == true) {
      if (local_50 == (FieldDescriptor *)0x0) {
        local_50 = *end._M_current;
      }
    }
    else {
      GenerateZeroInitFields::anon_class_24_3_f542e84b::operator()(&local_40,end);
    }
  }
  GenerateZeroInitFields::anon_class_24_3_f542e84b::operator()(&local_40,end);
  return;
}

Assistant:

void MessageGenerator::GenerateZeroInitFields(io::Printer* p) const {
  using Iterator = decltype(optimized_order_.begin());
  const FieldDescriptor* first = nullptr;
  auto emit_pending_zero_fields = [&](Iterator end) {
    if (first != nullptr) {
      const FieldDescriptor* last = end[-1];
      if (first != last ||
          !field_generators_.get(first).has_brace_default_assign()) {
        p->Emit({{"first", FieldName(first)},
                 {"last", FieldName(last)},
                 {"Impl", "Impl_"},
                 {"impl", "_impl_"}},
                R"cc(
                  ::memset(reinterpret_cast<char *>(&$impl$) +
                               offsetof($Impl$, $first$_),
                           0,
                           offsetof($Impl$, $last$_) -
                               offsetof($Impl$, $first$_) +
                               sizeof($Impl$::$last$_));
                )cc");
      } else {
        p->Emit({{"field", FieldMemberName(first, false)}},
                R"cc(
                  $field$ = {};
                )cc");
      }
      first = nullptr;
    }
  };

  auto it = optimized_order_.begin();
  auto end = optimized_order_.end();
  for (; it != end && !ShouldSplit(*it, options_); ++it) {
    auto const& generator = field_generators_.get(*it);
    if (generator.has_trivial_zero_default()) {
      if (first == nullptr) first = *it;
    } else {
      emit_pending_zero_fields(it);
    }
  }
  emit_pending_zero_fields(it);
}